

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O0

void __thiscall cmCPackArchiveGenerator::~cmCPackArchiveGenerator(cmCPackArchiveGenerator *this)

{
  cmCPackArchiveGenerator *this_local;
  
  (this->super_cmCPackGenerator).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCPackArchiveGenerator_00af0008;
  std::__cxx11::string::~string((string *)&this->ArchiveFormat);
  cmCPackGenerator::~cmCPackGenerator(&this->super_cmCPackGenerator);
  return;
}

Assistant:

cmCPackArchiveGenerator::~cmCPackArchiveGenerator()
{
}